

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlist.h
# Opt level: O0

value_type_conflict3 __thiscall QList<int>::takeFirst(QList<int> *this)

{
  int *piVar1;
  QPodArrayOps<int> *this_00;
  QArrayDataPointer<int> *in_RDI;
  value_type_conflict3 v;
  undefined4 in_stack_fffffffffffffff0;
  undefined4 in_stack_fffffffffffffff4;
  value_type_conflict3 vVar2;
  
  piVar1 = first((QList<int> *)CONCAT44(in_stack_fffffffffffffff4,in_stack_fffffffffffffff0));
  vVar2 = *piVar1;
  this_00 = (QPodArrayOps<int> *)QArrayDataPointer<int>::operator->(in_RDI);
  QtPrivate::QPodArrayOps<int>::eraseFirst(this_00);
  return vVar2;
}

Assistant:

value_type takeFirst() { Q_ASSERT(!isEmpty()); value_type v = std::move(first()); d->eraseFirst(); return v; }